

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callFunctionTestSuite.cpp
# Opt level: O0

int __thiscall Test::max<int>(Test *this,int *lhs,int *rhs)

{
  int local_6c;
  allocator<char> local_41;
  string local_40;
  int *local_20;
  int *rhs_local;
  int *lhs_local;
  Test *this_local;
  
  local_20 = rhs;
  rhs_local = lhs;
  lhs_local = (int *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"max",&local_41);
  incrementMethodVisitedCounter(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (*local_20 < *rhs_local) {
    local_6c = *rhs_local;
  }
  else {
    local_6c = *local_20;
  }
  return local_6c;
}

Assistant:

T max(T& lhs, T& rhs)
  {
    incrementMethodVisitedCounter("max");
    return (lhs > rhs) ? lhs : rhs;
  }